

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCAnalyzer.cpp
# Opt level: O0

void __thiscall SDMMCAnalyzer::AdvanceToNextClock(SDMMCAnalyzer *this)

{
  SDMMCSampleEdge SVar1;
  AnalyzerChannelData *pAVar2;
  uint uVar3;
  BitState search;
  SDMMCAnalyzer *this_local;
  
  SVar1 = (this->mSettings).mSampleEdge;
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    uVar3 = AnalyzerChannelData::GetBitState();
  } while (uVar3 != (SVar1 == SAMPLE_EDGE_RISING));
  pAVar2 = this->mCommand;
  AnalyzerChannelData::GetSampleNumber();
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar2);
  if ((this->mSettings).mBusWidth != BUS_WIDTH_0) {
    pAVar2 = this->mData0;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar2);
  }
  if (((this->mSettings).mBusWidth == BUS_WIDTH_4) || ((this->mSettings).mBusWidth == BUS_WIDTH_8))
  {
    pAVar2 = this->mData1;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar2);
    pAVar2 = this->mData2;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar2);
    pAVar2 = this->mData3;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar2);
  }
  if ((this->mSettings).mBusWidth == BUS_WIDTH_8) {
    pAVar2 = this->mData4;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar2);
    pAVar2 = this->mData5;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar2);
    pAVar2 = this->mData6;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar2);
    pAVar2 = this->mData7;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar2);
  }
  return;
}

Assistant:

void SDMMCAnalyzer::AdvanceToNextClock()
{
	enum BitState search = mSettings.mSampleEdge == SAMPLE_EDGE_RISING ? BIT_HIGH : BIT_LOW;

	do {
		mClock->AdvanceToNextEdge();
	} while (mClock->GetBitState() != search);

	mCommand->AdvanceToAbsPosition(mClock->GetSampleNumber());
	if (mSettings.mBusWidth != BUS_WIDTH_0)
		mData0->AdvanceToAbsPosition(mClock->GetSampleNumber());
	if (mSettings.mBusWidth == BUS_WIDTH_4 ||
			mSettings.mBusWidth == BUS_WIDTH_8) {
		mData1->AdvanceToAbsPosition(mClock->GetSampleNumber());
		mData2->AdvanceToAbsPosition(mClock->GetSampleNumber());
		mData3->AdvanceToAbsPosition(mClock->GetSampleNumber());
	}
	if (mSettings.mBusWidth == BUS_WIDTH_8) {
		mData4->AdvanceToAbsPosition(mClock->GetSampleNumber());
		mData5->AdvanceToAbsPosition(mClock->GetSampleNumber());
		mData6->AdvanceToAbsPosition(mClock->GetSampleNumber());
		mData7->AdvanceToAbsPosition(mClock->GetSampleNumber());
	}
}